

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O2

void CopyPlayer(player_t *dst,player_t *src,char *name)

{
  userinfo_t *o;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  FPlayerSkin *pFVar4;
  int iVar5;
  DBot *pDVar6;
  TObjPtr<DPSprite> *obj;
  DPSprite *pDVar7;
  botinfo_t *pbVar8;
  userinfo_t uibackup2;
  userinfo_t uibackup;
  TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> local_60;
  TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> local_48;
  
  TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::TMap(&local_48);
  TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::TMap(&local_60);
  o = &dst->userinfo;
  TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::TransferFrom
            (&local_48,
             &o->super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>);
  TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::TransferFrom
            (&local_60,
             &(src->userinfo).
              super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>);
  uVar3 = dst->cheats;
  bVar1 = dst->attackdown;
  bVar2 = dst->usedown;
  player_t::operator=(dst,src);
  dst->cheats = dst->cheats | uVar3 & 0x20;
  pDVar6 = GC::ReadBarrier<DBot>((DBot **)&dst->Bot);
  if (pDVar6 == (DBot *)0x0) {
    TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::TransferFrom
              (&o->super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>,
               &local_48);
  }
  else {
    pbVar8 = (botinfo_t *)&bglobal.botinfo;
    do {
      pbVar8 = pbVar8->next;
      if (pbVar8 == (botinfo_t *)0x0) goto LAB_004c99fe;
      iVar5 = strcasecmp(name,pbVar8->name);
    } while (iVar5 != 0);
    pbVar8->inuse = 2;
LAB_004c99fe:
    bglobal.botnum = bglobal.botnum + 1;
    TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::TransferFrom
              (&o->super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>,
               &local_60);
  }
  pFVar4 = skins;
  iVar5 = userinfo_t::GetSkin(o);
  iVar5 = R_FindSkin(pFVar4[iVar5].name,(uint)dst->CurrentPlayerClass);
  userinfo_t::SkinNumChanged(o,iVar5);
  if (dst->mo != (APlayerPawn *)0x0) {
    (dst->mo->super_AActor).player = dst;
  }
  obj = &dst->psprites;
  while( true ) {
    pDVar7 = GC::ReadBarrier<DPSprite>((DPSprite **)obj);
    if (pDVar7 == (DPSprite *)0x0) break;
    pDVar7->Owner = dst;
    obj = &pDVar7->Next;
  }
  (src->psprites).field_0.p = (DPSprite *)0x0;
  dst->attackdown = bVar1;
  dst->usedown = bVar2;
  userinfo_t::~userinfo_t((userinfo_t *)&local_60);
  userinfo_t::~userinfo_t((userinfo_t *)&local_48);
  return;
}

Assistant:

void CopyPlayer (player_t *dst, player_t *src, const char *name)
{
	// The userinfo needs to be saved for real players, but it
	// needs to come from the save for bots.
	userinfo_t uibackup;
	userinfo_t uibackup2;

	uibackup.TransferFrom(dst->userinfo);
	uibackup2.TransferFrom(src->userinfo);

	int chasecam = dst->cheats & CF_CHASECAM;	// Remember the chasecam setting
	bool attackdown = dst->attackdown;
	bool usedown = dst->usedown;

	
	*dst = *src;		// To avoid memory leaks at this point the userinfo in src must be empty which is taken care of by the TransferFrom call above.

	dst->cheats |= chasecam;

	if (dst->Bot != nullptr)
	{
		botinfo_t *thebot = bglobal.botinfo;
		while (thebot && stricmp (name, thebot->name))
		{
			thebot = thebot->next;
		}
		if (thebot)
		{
			thebot->inuse = BOTINUSE_Yes;
		}
		bglobal.botnum++;
		dst->userinfo.TransferFrom(uibackup2);
	}
	else
	{
		dst->userinfo.TransferFrom(uibackup);
	}
	// Validate the skin
	dst->userinfo.SkinNumChanged(R_FindSkin(skins[dst->userinfo.GetSkin()].name, dst->CurrentPlayerClass));

	// Make sure the player pawn points to the proper player struct.
	if (dst->mo != nullptr)
	{
		dst->mo->player = dst;
	}

	// Same for the psprites.
	DPSprite *pspr = dst->psprites;
	while (pspr)
	{
		pspr->Owner = dst;

		pspr = pspr->Next;
	}

	// Don't let the psprites be destroyed when src is destroyed.
	src->psprites = nullptr;

	// These 2 variables may not be overwritten.
	dst->attackdown = attackdown;
	dst->usedown = usedown;
}